

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

void Abc_NtkOrderCisCos(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  long *plVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  long lVar8;
  
  pNtk->vCis->nSize = 0;
  pNtk->vCos->nSize = 0;
  pVVar6 = pNtk->vPis;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      pvVar3 = pVVar6->pArray[lVar8];
      pVVar6 = pNtk->vCis;
      uVar1 = pVVar6->nSize;
      if (uVar1 == pVVar6->nCap) {
        if ((int)uVar1 < 0x10) {
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
          }
          pVVar6->pArray = ppvVar5;
          pVVar6->nCap = 0x10;
        }
        else {
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar1 << 4);
          }
          pVVar6->pArray = ppvVar5;
          pVVar6->nCap = uVar1 * 2;
        }
      }
      else {
        ppvVar5 = pVVar6->pArray;
      }
      iVar2 = pVVar6->nSize;
      pVVar6->nSize = iVar2 + 1;
      ppvVar5[iVar2] = pvVar3;
      lVar8 = lVar8 + 1;
      pVVar6 = pNtk->vPis;
    } while (lVar8 < pVVar6->nSize);
  }
  pVVar6 = pNtk->vPos;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      pvVar3 = pVVar6->pArray[lVar8];
      pVVar6 = pNtk->vCos;
      uVar1 = pVVar6->nSize;
      if (uVar1 == pVVar6->nCap) {
        if ((int)uVar1 < 0x10) {
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
          }
          pVVar6->pArray = ppvVar5;
          pVVar6->nCap = 0x10;
        }
        else {
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar1 << 4);
          }
          pVVar6->pArray = ppvVar5;
          pVVar6->nCap = uVar1 * 2;
        }
      }
      else {
        ppvVar5 = pVVar6->pArray;
      }
      iVar2 = pVVar6->nSize;
      pVVar6->nSize = iVar2 + 1;
      ppvVar5[iVar2] = pvVar3;
      lVar8 = lVar8 + 1;
      pVVar6 = pNtk->vPos;
    } while (lVar8 < pVVar6->nSize);
  }
  pVVar6 = pNtk->vBoxes;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      plVar4 = (long *)pVVar6->pArray[lVar8];
      if ((*(uint *)((long)plVar4 + 0x14) & 0xf) != 8) {
        if (0 < *(int *)((long)plVar4 + 0x1c)) {
          lVar7 = 0;
          do {
            pvVar3 = *(void **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                               (long)*(int *)(plVar4[4] + lVar7 * 4) * 8);
            pVVar6 = pNtk->vCos;
            uVar1 = pVVar6->nSize;
            if (uVar1 == pVVar6->nCap) {
              if ((int)uVar1 < 0x10) {
                if (pVVar6->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(0x80);
                }
                else {
                  ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
                }
                pVVar6->pArray = ppvVar5;
                pVVar6->nCap = 0x10;
              }
              else {
                if (pVVar6->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar1 << 4);
                }
                pVVar6->pArray = ppvVar5;
                pVVar6->nCap = uVar1 * 2;
              }
            }
            else {
              ppvVar5 = pVVar6->pArray;
            }
            iVar2 = pVVar6->nSize;
            pVVar6->nSize = iVar2 + 1;
            ppvVar5[iVar2] = pvVar3;
            lVar7 = lVar7 + 1;
          } while (lVar7 < *(int *)((long)plVar4 + 0x1c));
        }
        if (0 < *(int *)((long)plVar4 + 0x2c)) {
          lVar7 = 0;
          do {
            pvVar3 = *(void **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                               (long)*(int *)(plVar4[6] + lVar7 * 4) * 8);
            pVVar6 = pNtk->vCis;
            uVar1 = pVVar6->nSize;
            if (uVar1 == pVVar6->nCap) {
              if ((int)uVar1 < 0x10) {
                if (pVVar6->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(0x80);
                }
                else {
                  ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
                }
                pVVar6->pArray = ppvVar5;
                pVVar6->nCap = 0x10;
              }
              else {
                if (pVVar6->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar1 << 4);
                }
                pVVar6->pArray = ppvVar5;
                pVVar6->nCap = uVar1 * 2;
              }
            }
            else {
              ppvVar5 = pVVar6->pArray;
            }
            iVar2 = pVVar6->nSize;
            pVVar6->nSize = iVar2 + 1;
            ppvVar5[iVar2] = pvVar3;
            lVar7 = lVar7 + 1;
          } while (lVar7 < *(int *)((long)plVar4 + 0x2c));
        }
      }
      lVar8 = lVar8 + 1;
      pVVar6 = pNtk->vBoxes;
    } while (lVar8 < pVVar6->nSize);
    if (0 < pVVar6->nSize) {
      lVar8 = 0;
      do {
        plVar4 = (long *)pVVar6->pArray[lVar8];
        if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 8) {
          if (0 < *(int *)((long)plVar4 + 0x1c)) {
            lVar7 = 0;
            do {
              pvVar3 = *(void **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                 (long)*(int *)(plVar4[4] + lVar7 * 4) * 8);
              pVVar6 = pNtk->vCos;
              uVar1 = pVVar6->nSize;
              if (uVar1 == pVVar6->nCap) {
                if ((int)uVar1 < 0x10) {
                  if (pVVar6->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
                  }
                  pVVar6->pArray = ppvVar5;
                  pVVar6->nCap = 0x10;
                }
                else {
                  if (pVVar6->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
                  }
                  else {
                    ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar1 << 4);
                  }
                  pVVar6->pArray = ppvVar5;
                  pVVar6->nCap = uVar1 * 2;
                }
              }
              else {
                ppvVar5 = pVVar6->pArray;
              }
              iVar2 = pVVar6->nSize;
              pVVar6->nSize = iVar2 + 1;
              ppvVar5[iVar2] = pvVar3;
              lVar7 = lVar7 + 1;
            } while (lVar7 < *(int *)((long)plVar4 + 0x1c));
          }
          if (0 < *(int *)((long)plVar4 + 0x2c)) {
            lVar7 = 0;
            do {
              pvVar3 = *(void **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                 (long)*(int *)(plVar4[6] + lVar7 * 4) * 8);
              pVVar6 = pNtk->vCis;
              uVar1 = pVVar6->nSize;
              if (uVar1 == pVVar6->nCap) {
                if ((int)uVar1 < 0x10) {
                  if (pVVar6->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
                  }
                  pVVar6->pArray = ppvVar5;
                  pVVar6->nCap = 0x10;
                }
                else {
                  if (pVVar6->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
                  }
                  else {
                    ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar1 << 4);
                  }
                  pVVar6->pArray = ppvVar5;
                  pVVar6->nCap = uVar1 * 2;
                }
              }
              else {
                ppvVar5 = pVVar6->pArray;
              }
              iVar2 = pVVar6->nSize;
              pVVar6->nSize = iVar2 + 1;
              ppvVar5[iVar2] = pvVar3;
              lVar7 = lVar7 + 1;
            } while (lVar7 < *(int *)((long)plVar4 + 0x2c));
          }
        }
        lVar8 = lVar8 + 1;
        pVVar6 = pNtk->vBoxes;
      } while (lVar8 < pVVar6->nSize);
    }
  }
  return;
}

Assistant:

void Abc_NtkOrderCisCos( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pTerm;
    int i, k;
    Vec_PtrClear( pNtk->vCis );
    Vec_PtrClear( pNtk->vCos );
    Abc_NtkForEachPi( pNtk, pObj, i )
        Vec_PtrPush( pNtk->vCis, pObj );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Vec_PtrPush( pNtk->vCos, pObj );
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        if ( Abc_ObjIsLatch(pObj) )
            continue;
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Vec_PtrPush( pNtk->vCos, pTerm );
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Vec_PtrPush( pNtk->vCis, pTerm );
    }
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        if ( !Abc_ObjIsLatch(pObj) )
            continue;
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Vec_PtrPush( pNtk->vCos, pTerm );
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Vec_PtrPush( pNtk->vCis, pTerm );
    }
}